

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O3

void __thiscall
helics::CommsInterface::setRequireBrokerConnection
          (CommsInterface *this,bool requireBrokerConnection)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  
  cVar2 = '\0';
  while( true ) {
    LOCK();
    cVar1 = (this->operating)._M_base._M_i;
    bVar3 = cVar2 == cVar1;
    if (bVar3) {
      (this->operating)._M_base._M_i = true;
      cVar1 = cVar2;
    }
    cVar2 = cVar1;
    UNLOCK();
    if (bVar3) break;
    if ((this->txStatus)._M_i != STARTUP) {
      return;
    }
  }
  this->mRequireBrokerConnection = requireBrokerConnection;
  LOCK();
  if ((this->operating)._M_base._M_i == true) {
    (this->operating)._M_base._M_i = false;
  }
  UNLOCK();
  return;
}

Assistant:

void CommsInterface::setRequireBrokerConnection(bool requireBrokerConnection)
{
    if (propertyLock()) {
        mRequireBrokerConnection = requireBrokerConnection;
        propertyUnLock();
    }
}